

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr_bounds.h
# Opt level: O2

PreprocessInfoStd * __thiscall
mp::
BoundComputations<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::ComputeBoundsAndType
          (PreprocessInfoStd *__return_storage_ptr__,
          BoundComputations<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
          *this,LinTerms *lt)

{
  ptr pdVar1;
  ptr piVar2;
  Type TVar3;
  long lVar4;
  BoundComputations<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *pBVar5;
  BoundComputations<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *pBVar6;
  size_ty sVar7;
  Type TVar8;
  Type TVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  __return_storage_ptr__->lb_ = -INFINITY;
  __return_storage_ptr__->result_var_ = -1;
  pdVar1 = (lt->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
           super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr;
  sVar7 = (lt->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_size;
  piVar2 = (lt->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
           super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
  dVar12 = 0.0;
  dVar13 = 0.0;
  TVar3 = INTEGER;
  while (TVar8 = TVar3, sVar7 = sVar7 - 1, sVar7 != 0xffffffffffffffff) {
    dVar11 = pdVar1[sVar7];
    lVar4 = (long)piVar2[sVar7];
    pBVar5 = this + 0x40;
    if (dVar11 < 0.0) {
      pBVar5 = this + 0x58;
    }
    pBVar6 = this + 0x58;
    if (dVar11 < 0.0) {
      pBVar6 = this + 0x40;
    }
    dVar12 = *(double *)(*(long *)pBVar5 + lVar4 * 8) * dVar11 + dVar12;
    dVar13 = *(double *)(*(long *)pBVar6 + lVar4 * 8) * dVar11 + dVar13;
    TVar9 = CONTINUOUS;
    TVar3 = TVar9;
    if (*(int *)(*(long *)(this + 0xa0) + lVar4 * 4) == 1) {
      dVar10 = floor(dVar11);
      dVar11 = ceil(dVar11);
      if ((dVar10 == dVar11) && (TVar3 = TVar8, NAN(dVar10) || NAN(dVar11))) {
        TVar3 = TVar9;
      }
    }
  }
  __return_storage_ptr__->lb_ = dVar12;
  __return_storage_ptr__->ub_ = dVar13;
  __return_storage_ptr__->type_ = TVar8;
  return __return_storage_ptr__;
}

Assistant:

PreprocessInfoStd ComputeBoundsAndType(const LinTerms& lt)
      const {
    PreprocessInfoStd result;
    result.lb_ = result.ub_ = 0.0;
    result.type_ = var::INTEGER;
    auto& model = MPCD( GetModel() );
    for (auto i=lt.size(); i--; ) {
      auto v = lt.var(i);
      auto c = lt.coef(i);
      if (c >= 0.0) {
        result.lb_ += c * model.lb(v);
        result.ub_ += c * model.ub(v);
      } else {
        result.lb_ += c * model.ub(v);
        result.ub_ += c * model.lb(v);
      }
      if (var::INTEGER!=model.var_type(v)
          || !is_integer(c)) {
        result.type_=var::CONTINUOUS;
      }
    }
    return result;
  }